

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Document::Document(Document *this,Stream *S)

{
  bool bVar1;
  mapped_type *pmVar2;
  Token local_a8;
  Token *local_70;
  Token *T;
  StringRef local_58;
  StringRef local_48 [2];
  StringRef local_28;
  Stream *local_18;
  Stream *S_local;
  Document *this_local;
  
  this->stream = S;
  local_18 = S;
  S_local = (Stream *)this;
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
            (&this->NodeAllocator);
  this->Root = (Node *)0x0;
  std::
  map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
  ::map(&this->TagMap);
  StringRef::StringRef(&local_28,"!");
  StringRef::StringRef(local_48,"!");
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,local_48);
  pmVar2->Data = local_28.Data;
  pmVar2->Length = local_28.Length;
  StringRef::StringRef(&local_58,"tag:yaml.org,2002:");
  StringRef::StringRef((StringRef *)&T,"!!");
  pmVar2 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)&T);
  pmVar2->Data = local_58.Data;
  pmVar2->Length = local_58.Length;
  bVar1 = parseDirectives(this);
  if (bVar1) {
    expectToken(this,5);
  }
  local_70 = peekNext(this);
  if (local_70->Kind == TK_DocumentStart) {
    getNext(&local_a8,this);
    Token::~Token(&local_a8);
  }
  return;
}

Assistant:

Document::Document(Stream &S) : stream(S), Root(nullptr) {
  // Tag maps starts with two default mappings.
  TagMap["!"] = "!";
  TagMap["!!"] = "tag:yaml.org,2002:";

  if (parseDirectives())
    expectToken(Token::TK_DocumentStart);
  Token &T = peekNext();
  if (T.Kind == Token::TK_DocumentStart)
    getNext();
}